

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void slang::ast::SFormat::formatArg
               (string *result,ConstantValue *arg,Type *type,char specifier,FormatOptions *options,
               bool isStringLiteral)

{
  byte bVar1;
  SmallVector<char,_8UL> fmt;
  
  bVar1 = charToLower(specifier);
  (*(code *)(&DAT_004aed24 + *(int *)(&DAT_004aed24 + (ulong)(bVar1 - 0x62) * 4)))();
  return;
}

Assistant:

void formatArg(std::string& result, const ConstantValue& arg, const Type& type, char specifier,
               const FormatOptions& options, bool isStringLiteral) {
    switch (charToLower(specifier)) {
        case 'h':
        case 'x':
            formatInt(result, arg.convertToInt().integer(), LiteralBase::Hex, options);
            return;
        case 'd':
            formatInt(result, arg.convertToInt().integer(), LiteralBase::Decimal, options);
            return;
        case 'o':
            formatInt(result, arg.convertToInt().integer(), LiteralBase::Octal, options);
            return;
        case 'b':
            formatInt(result, arg.convertToInt().integer(), LiteralBase::Binary, options);
            return;
        case 'u':
            formatRaw2(result, arg);
            return;
        case 'z':
            formatRaw4(result, arg);
            return;
        case 'e':
        case 'f':
        case 'g':
            formatFloat(result, arg.convertToReal().real(), specifier, options);
            return;
        case 't': {
            auto timeOptions = options;
            if (!timeOptions.width)
                timeOptions.width = 20;
            formatInt(result, arg.convertToInt().integer(), LiteralBase::Decimal, timeOptions);
            return;
        }
        case 'c':
            formatChar(result, arg.convertToInt().integer());
            return;
        case 'v':
            formatStrength(result, arg.integer());
            return;
        case 'p':
            formatPattern(result, arg, type, options, isStringLiteral);
            return;
        case 's':
            formatString(result, arg.convertToStr().str(), options);
            return;
        default:
            SLANG_UNREACHABLE;
    }
}